

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

iterator * __thiscall pybind11::detail::values_and_holders::iterator::operator++(iterator *this)

{
  ulong uVar1;
  size_t sVar2;
  pointer pptVar3;
  type_info *ptVar4;
  
  if ((this->inst->field_0x30 & 2) == 0) {
    (this->curr).vh =
         (this->curr).vh +
         (this->types->
         super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
         )._M_impl.super__Vector_impl_data._M_start[(this->curr).index]->holder_size_in_ptrs + 1;
  }
  sVar2 = (this->curr).index;
  uVar1 = sVar2 + 1;
  (this->curr).index = uVar1;
  pptVar3 = (this->types->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)(this->types->
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar3 >> 3)) {
    ptVar4 = pptVar3[sVar2 + 1];
  }
  else {
    ptVar4 = (type_info *)0x0;
  }
  (this->curr).type = ptVar4;
  return this;
}

Assistant:

iterator &operator++() {
            if (!inst->simple_layout) {
                curr.vh += 1 + (*types)[curr.index]->holder_size_in_ptrs;
            }
            ++curr.index;
            curr.type = curr.index < types->size() ? (*types)[curr.index] : nullptr;
            return *this;
        }